

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolylineMapper.h
# Opt level: O0

tuple<double,_long,_double,_long> * __thiscall
anurbs::PolylineMapper<3L>::map
          (tuple<double,_long,_double,_long> *__return_storage_ptr__,PolylineMapper<3L> *this,
          Vector *point,double tolerance)

{
  vector<long,_std::allocator<long>_> *__n;
  bool bVar1;
  Scalar *pSVar2;
  size_type *psVar3;
  reference pvVar4;
  undefined1 *local_1a0;
  double local_198;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>
  local_190;
  RealScalar local_178;
  double distance;
  type *cp;
  type *t;
  undefined1 local_140 [8];
  Vector line_b;
  Vector line_a;
  Index i_1;
  const_iterator __end0;
  const_iterator __begin0;
  vector<long,_std::allocator<long>_> *__range2;
  Index closest_index;
  double closest_parameter;
  double closest_distance;
  function<bool_(long)> local_c8;
  Matrix<double,_1,_3,_1,_1,_3> local_a8;
  Matrix<double,_1,_3,_1,_1,_3> local_90;
  undefined1 local_78 [8];
  vector<long,_std::allocator<long>_> indices;
  Index i;
  Vector box_b;
  Vector box_a;
  double tolerance_local;
  Vector *point_local;
  PolylineMapper<3L> *this_local;
  
  Eigen::Matrix<double,_1,_3,_1,_1,_3>::Matrix
            ((Matrix<double,_1,_3,_1,_1,_3> *)
             (box_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
              array + 2),point);
  Eigen::Matrix<double,_1,_3,_1,_1,_3>::Matrix((Matrix<double,_1,_3,_1,_1,_3> *)&i,point);
  for (indices.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage = (pointer)0x0;
      (long)indices.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage < 3;
      indices.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)((long)indices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 1)) {
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)
                        (box_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                         m_storage.m_data.array + 2),
                        (Index)indices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage);
    *pSVar2 = tolerance + *pSVar2;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)&i,
                        (Index)indices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage);
    *pSVar2 = *pSVar2 - tolerance;
  }
  Eigen::Matrix<double,_1,_3,_1,_1,_3>::Matrix
            (&local_90,
             (Matrix<double,_1,_3,_1,_1,_3> *)
             (box_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
              array + 2));
  Eigen::Matrix<double,_1,_3,_1,_1,_3>::Matrix(&local_a8,(Matrix<double,_1,_3,_1,_1,_3> *)&i);
  std::function<bool_(long)>::function(&local_c8,(nullptr_t)0x0);
  RTree<3L>::by_box((vector<long,_std::allocator<long>_> *)local_78,&this->m_rtree,&local_90,
                    &local_a8,&local_c8);
  std::function<bool_(long)>::~function(&local_c8);
  closest_parameter = INFINITY;
  closest_index = 0;
  __range2 = (vector<long,_std::allocator<long>_> *)0x0;
  __end0 = std::vector<long,_std::allocator<long>_>::begin
                     ((vector<long,_std::allocator<long>_> *)local_78);
  i_1 = (Index)std::vector<long,_std::allocator<long>_>::end
                         ((vector<long,_std::allocator<long>_> *)local_78);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>
                                     *)&i_1), bVar1) {
    psVar3 = (size_type *)
             __gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>::
             operator*(&__end0);
    __n = (vector<long,_std::allocator<long>_> *)*psVar3;
    pvVar4 = std::
             vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
             ::operator[](&this->m_points,(size_type)__n);
    Eigen::Matrix<double,_1,_3,_1,_1,_3>::Matrix
              ((Matrix<double,_1,_3,_1,_1,_3> *)
               (line_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data
                .array + 2),pvVar4);
    pvVar4 = std::
             vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
             ::operator[](&this->m_points,
                          (size_type)
                          ((long)&(__n->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                                  super__Vector_impl_data._M_start + 1));
    Eigen::Matrix<double,_1,_3,_1,_1,_3>::Matrix((Matrix<double,_1,_3,_1,_1,_3> *)local_140,pvVar4);
    Line<3L>::closest_point
              ((pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)&t,point,
               (Vector *)
               (line_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data
                .array + 2),(Vector *)local_140,false);
    cp = (type *)std::get<0ul,double,Eigen::Matrix<double,1,3,1,1,3>>
                           ((pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)&t);
    distance = (double)std::get<1ul,double,Eigen::Matrix<double,1,3,1,1,3>>
                                 ((pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)&t);
    Eigen::MatrixBase<Eigen::Matrix<double,1,3,1,1,3>>::operator-
              (&local_190,(MatrixBase<Eigen::Matrix<double,1,3,1,1,3>> *)point,
               (MatrixBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)distance);
    local_178 = Eigen::
                MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                ::norm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                        *)&local_190);
    if ((local_178 <= closest_parameter) && (local_178 <= tolerance)) {
      closest_index =
           (Index)(cp->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.
                  m_data.array[0];
      __range2 = __n;
      closest_parameter = local_178;
    }
    __gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>::
    operator++(&__end0);
  }
  local_198 = 1.0 - (double)closest_index;
  local_1a0 = (undefined1 *)
              ((long)&(__range2->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                      super__Vector_impl_data._M_start + 1);
  std::tuple<double,_long,_double,_long>::tuple<double,_long_&,_double_&,_long,_true,_true>
            (__return_storage_ptr__,&local_198,(long *)&__range2,(double *)&closest_index,
             (long *)&local_1a0);
  std::vector<long,_std::allocator<long>_>::~vector((vector<long,_std::allocator<long>_> *)local_78)
  ;
  return __return_storage_ptr__;
}

Assistant:

std::tuple<double, Index, double, Index> map(const Vector point, const double tolerance)
    {
        Vector box_a = point;
        Vector box_b = point;
        
        for (Index i = 0; i < TDimension; i++) {
            box_a[i] += tolerance;
            box_b[i] -= tolerance;
        }

        const auto indices = m_rtree.by_box(box_a, box_b);

        double closest_distance = Infinity;
        double closest_parameter = 0;
        Index closest_index = 0;

        for (const Index i : indices) {
            Vector line_a = m_points[i];
            Vector line_b = m_points[i + 1];

            const auto [t, cp] = Line<TDimension>::closest_point(point, line_a, line_b);

            const double distance = (point - cp).norm();

            if (distance > closest_distance || distance > tolerance) {
                continue;
            }
            
            closest_distance = distance;
            closest_parameter = t;
            closest_index = i;
        }

        return {1.0 - closest_parameter, closest_index, closest_parameter, closest_index + 1};
    }